

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_StatusCode editMethodCallback(UA_Server *server,UA_Session *session,UA_Node *node,void *handle)

{
  UA_StatusCode UVar1;
  
  UVar1 = 0x805f0000;
  if (node->nodeClass == UA_NODECLASS_METHOD) {
    node[1].nodeId.identifier.string.data = *handle;
    node[1].nodeId.identifier.string.length = *(size_t *)((long)handle + 8);
    UVar1 = 0;
  }
  return UVar1;
}

Assistant:

static UA_StatusCode
editMethodCallback(UA_Server *server, UA_Session* session,
                   UA_Node* node, const void* handle) {
    if(node->nodeClass != UA_NODECLASS_METHOD)
        return UA_STATUSCODE_BADNODECLASSINVALID;
    const struct addMethodCallback *newCallback = handle;
    UA_MethodNode *mnode = (UA_MethodNode*) node;
    mnode->attachedMethod = newCallback->callback;
    mnode->methodHandle   = newCallback->handle;
    return UA_STATUSCODE_GOOD;
}